

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O3

uint __thiscall
ON_SubDSectorType::GetAllEigenvalues
          (ON_SubDSectorType *this,double *eigenvalues,size_t eigenvalues_capacity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  ON_SubDVertexTag vertex_tag;
  uint R;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint k;
  uint uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM0_Qb;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  int iVar19;
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 in_XMM7 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  int local_90;
  uint local_8c;
  
  auVar2 = _DAT_0069b120;
  if (eigenvalues_capacity == 0) {
    eigenvalues = (double *)0x0;
  }
  else {
    if (eigenvalues == (double *)0x0) goto LAB_0061eb0a;
    lVar10 = eigenvalues_capacity - 1;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_0069b120;
    auVar15 = _DAT_0069b170;
    do {
      auVar18 = auVar15 ^ auVar2;
      auVar21._0_4_ = -(uint)(auVar13._0_4_ < auVar18._0_4_);
      auVar21._4_4_ = -(uint)(auVar13._4_4_ < auVar18._4_4_);
      auVar21._8_4_ = -(uint)(auVar13._8_4_ < auVar18._8_4_);
      auVar21._12_4_ = -(uint)(auVar13._12_4_ < auVar18._12_4_);
      iVar19 = -(uint)(auVar18._4_4_ == auVar13._4_4_);
      iVar20 = -(uint)(auVar18._12_4_ == auVar13._12_4_);
      auVar23._4_4_ = iVar19;
      auVar23._0_4_ = iVar19;
      auVar23._8_4_ = iVar20;
      auVar23._12_4_ = iVar20;
      in_XMM7 = auVar23 & auVar21;
      auVar18._4_4_ = auVar21._4_4_;
      auVar18._0_4_ = auVar21._4_4_;
      auVar18._8_4_ = auVar21._12_4_;
      auVar18._12_4_ = auVar21._12_4_;
      if ((~SUB164(auVar18 | in_XMM7,0) & 1) != 0) {
        eigenvalues[uVar8] = -1.23432101234321e+308;
      }
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      if ((((auVar18 | in_XMM7) ^ auVar1) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        eigenvalues[uVar8 + 1] = -1.23432101234321e+308;
      }
      uVar8 = uVar8 + 2;
      lVar10 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar10 + 2;
    } while ((eigenvalues_capacity + 1 & 0xfffffffffffffffe) != uVar8);
  }
  bVar3 = IsValid(this);
  if (((bVar3) && (R = PointRingCount(this), R != 0)) &&
     (eigenvalues == (double *)0x0 || R <= eigenvalues_capacity)) {
    vertex_tag = VertexTag(this);
    uVar4 = EdgeCount(this);
    bVar3 = ON_SubD::IsValidSectorEdgeCount(vertex_tag,uVar4);
    if (bVar3) {
      if (vertex_tag == Smooth) {
        if (eigenvalues == (double *)0x0) {
          return R;
        }
        dVar11 = (double)(uVar4 * 3 - 7);
        *eigenvalues = 1.0;
        dVar14 = SQRT((double)((uVar4 * 5 + -0x1e) * uVar4 + 0x31));
        dVar16 = 0.125;
        uVar6 = uVar4;
        uVar5 = uVar4;
        if ((uVar4 & 1) == 0 && uVar4 != 0) {
          do {
            uVar5 = uVar6 >> 1;
            dVar16 = dVar16 * 0.5;
            if (uVar6 == 0) break;
            uVar7 = uVar6 & 2;
            uVar6 = uVar5;
          } while (uVar7 == 0);
        }
        eigenvalues[1] = (dVar16 / (double)uVar5) * (dVar14 + dVar11);
        eigenvalues[2] = (dVar16 / (double)uVar5) * (dVar11 - dVar14);
        if (1 < uVar4) {
          uVar6 = uVar4 * 2;
          uVar5 = 1;
          local_8c = 2;
          local_90 = -1;
          lVar10 = 0;
          do {
            uVar24 = in_XMM7._8_8_;
            uVar6 = uVar6 - 2;
            iVar19 = (int)lVar10;
            uVar9 = iVar19 + 2;
            uVar7 = uVar9;
            if (uVar4 < uVar9) {
              uVar7 = uVar6;
            }
            k = uVar4 - uVar7;
            if (uVar7 * 2 <= uVar4) {
              k = uVar7;
            }
            dVar11 = eigenvalue_cos(k,uVar4);
            if (uVar4 < uVar7 * 2) {
              dVar11 = -dVar11;
            }
            uVar7 = local_8c;
            if (uVar4 < local_8c) {
              uVar7 = uVar4;
            }
            dVar14 = eigenvalue_cos(uVar7 + local_90,uVar4);
            if (uVar4 < uVar9) {
              dVar14 = -dVar14;
            }
            dVar16 = ((double)uVar5 * 3.141592653589793) / (double)uVar4;
            dVar12 = cos(dVar16 + dVar16);
            if (1e-06 < ABS(dVar11 - dVar12)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x74,"","bogus c1");
            }
            dVar16 = cos(dVar16);
            if (1e-06 < ABS(dVar14 - dVar16)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x79,"","bogus c2");
            }
            dVar16 = dVar11 + 5.0;
            if ((uVar7 + local_90) * 4 == uVar4) {
              dVar12 = dVar11 / 9.0 + 1.0;
              if (dVar12 < 0.0) {
                dVar12 = sqrt(dVar12);
              }
              else {
                dVar12 = SQRT(dVar12);
              }
              dVar12 = (double)(~-(ulong)(dVar14 < 0.0) & (ulong)dVar12 |
                               (ulong)-dVar12 & -(ulong)(dVar14 < 0.0));
            }
            else {
              dVar12 = dVar11 / 4.5 + 2.0;
              if (dVar12 < 0.0) {
                dVar12 = sqrt(dVar12);
              }
              else {
                dVar12 = SQRT(dVar12);
              }
              dVar12 = dVar12 * dVar14;
            }
            dVar17 = dVar11 + dVar11 + 18.0;
            in_XMM7._0_8_ = SQRT(dVar17);
            in_XMM7._8_8_ = uVar24;
            dVar11 = in_XMM7._0_8_;
            if (dVar17 < 0.0) {
              dVar11 = sqrt(dVar17);
              in_XMM7._8_8_ = 0;
            }
            if (dVar17 < 0.0) {
              dVar17 = sqrt(dVar17);
              in_XMM7._8_8_ = extraout_XMM0_Qb;
              in_XMM7._0_8_ = dVar17;
            }
            dVar17 = (dVar16 - dVar12 * 3.0) * 0.0625;
            dVar22 = in_XMM7._0_8_;
            if (1e-06 < ABS((dVar16 - dVar11 * dVar14) * 0.0625 - dVar17)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x8a,"","bogus lambda0");
            }
            dVar11 = (dVar16 + dVar12 * 3.0) * 0.0625;
            if (1e-06 < ABS((dVar14 * dVar22 + dVar16) * 0.0625 - dVar11)) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_matrix.cpp"
                         ,0x8f,"","bogus lambda1");
            }
            eigenvalues[iVar19 + 3] = dVar17;
            eigenvalues[iVar19 + 4] = dVar11;
            uVar5 = uVar5 + 1;
            local_8c = local_8c + 2;
            local_90 = local_90 + -1;
            lVar10 = lVar10 + 2;
          } while ((ulong)uVar4 * 2 + -2 != lVar10);
        }
        ON_SortDoubleArrayDecreasing(eigenvalues + 1,(ulong)(R - 1));
      }
      else if (uVar4 < 0x15 && vertex_tag == Crease) {
        if (eigenvalues == (double *)0x0) {
          return R;
        }
        uVar4 = GetQuadCreaseEigenvalues(uVar4,R,eigenvalues);
        if (R != uVar4) goto LAB_0061eb0a;
      }
      else if (eigenvalues == (double *)0x0) {
        return 0;
      }
      if ((*eigenvalues == 1.0) && (!NAN(*eigenvalues))) {
        return R;
      }
    }
  }
LAB_0061eb0a:
  ON_SubDIncrementErrorCount();
  return 0;
}

Assistant:

unsigned int ON_SubDSectorType::GetAllEigenvalues(
  double* eigenvalues,
  size_t eigenvalues_capacity
  )
{
  if ( 0 == eigenvalues_capacity)
    eigenvalues = nullptr;
  else
  {
    if (nullptr == eigenvalues)
      return ON_SUBD_RETURN_ERROR(0);

    for (size_t i = 0; i < eigenvalues_capacity; i++)
      eigenvalues[i] = ON_UNSET_VALUE;
  }

  if (false == IsValid())
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if ( 0  == R || (nullptr != eigenvalues && eigenvalues_capacity < R))
    return ON_SUBD_RETURN_ERROR(0);

  const ON_SubDVertexTag vertex_tag = VertexTag();
  const unsigned int N = EdgeCount();

  if (false == ON_SubD::IsValidSectorEdgeCount(vertex_tag, N))
    return ON_SUBD_RETURN_ERROR(0);

  if (ON_SubDVertexTag::Smooth == vertex_tag)
  {
    if (nullptr == eigenvalues)
    {
      // caller is asking if eigenvalues are available
      return R;
    }
    eigenvalues[0] = 1.0;

    double a = (3 * N - 7);
    double b = (N >= 6) ? ((5 * N - 30)*N + 49) : ((5 * N*N + 49) - 30 * N);
    double c = sqrt(b);
    double d = 0.125;
    unsigned int D = N;
    while (D > 0 && 0 == (D % 2))
    {
      D /= 2;
      d *= 0.5;
    }
    d /= ((double)D);

    eigenvalues[1] = d*(a + c);
    eigenvalues[2] = d*(a - c);

    for (unsigned int k = 1; k < N; k++)
    {
      double e2[2];
      GetQuadSubdivisionMatrix_eigenvalue_pair(k, N, e2);
      eigenvalues[2 * k + 1] = e2[0];
      eigenvalues[2 * k + 2] = e2[1];
    }

    // return sorted in decreasing order
    ON_SortDoubleArrayDecreasing(eigenvalues + 1, R - 1);
  }
  else if (ON_SubDVertexTag::Crease == vertex_tag)
  {
    if (N <= 20)
    {
      if (nullptr == eigenvalues)
      {
        // caller is asking if eigenvalues are available
        return R;
      }
      if (R != GetQuadCreaseEigenvalues(N, R, eigenvalues) || !(1.0 == eigenvalues[0]))
        return ON_SUBD_RETURN_ERROR(0);
    }
  }

  if (nullptr == eigenvalues)
  {
    // caller is asking if eigenvalues are available
    return 0; // not an error
  }

  if (!(1.0 == eigenvalues[0]))
    return ON_SUBD_RETURN_ERROR(0);

  return R;
}